

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O1

void __thiscall gfx::Program::check_validation(Program *this,GLuint shader)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  GLint max_length;
  GLint is_ok;
  string err;
  vector<char,_std::allocator<char>_> info_log;
  GLint local_d0;
  GLint local_cc;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<char,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_cc = 0;
  (*glad_glGetProgramiv)(this->id,0x8b83,&local_cc);
  if (local_cc != 0) {
    return;
  }
  local_d0 = 0;
  (*glad_glGetProgramiv)(this->id,0x8b84,&local_d0);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,(long)local_d0,(allocator_type *)&local_88);
  (*glad_glGetProgramInfoLog)
            (this->id,local_d0,(GLsizei *)0x0,
             local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"GLSL validation error for program: ","");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,&local_88,&this->name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_c8 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_c8 == plVar2) {
    local_b8 = *plVar2;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar2;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_a8 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_a8 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_a8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_validation(GLuint shader) {
        GLint is_ok = 0;
        glGetProgramiv(id, GL_VALIDATE_STATUS, &is_ok);
        if (!is_ok) {
			GLint max_length = 0;
            glGetProgramiv(id, GL_INFO_LOG_LENGTH, &max_length);

            // The maxLength includes the NULL character
            std::vector<GLchar> info_log(max_length);
            glGetProgramInfoLog(id, max_length, NULL, &info_log[0]);

            const std::string err = "GLSL validation error for program: ";
            throw std::runtime_error(err + name + "\n" + info_log.data());
		}
    }